

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallImportedRuntimeArtifactsGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallImportedRuntimeArtifactsGenerator::GenerateScriptForConfig
          (cmInstallImportedRuntimeArtifactsGenerator *this,ostream *os,string *config,Indent indent
          )

{
  bool bVar1;
  TargetType TVar2;
  RegularExpressionMatch *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  allocator_type local_1c9;
  string bundleDir;
  string bundleName;
  string soName;
  undefined1 local_158 [48];
  string bundlePath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  string location;
  RegularExpressionMatch match;
  
  cmGeneratorTarget::GetFullPath(&location,this->Target,config,RuntimeBinaryArtifact,false);
  TVar2 = cmGeneratorTarget::GetType(this->Target);
  if (TVar2 == EXECUTABLE) {
    bVar1 = cmGeneratorTarget::IsBundleOnApple(this->Target);
    if (bVar1) {
      memset(&match,0,0xa8);
      bVar1 = cmsys::RegularExpression::find
                        ((RegularExpression *)(anonymous_namespace)::BundleRegularExpression,
                         location._M_dataplus._M_p,&match);
      if (!bVar1) goto LAB_00386977;
      cmsys::RegularExpressionMatch::match_abi_cxx11_(&bundleDir,&match,1);
      cmsys::RegularExpressionMatch::match_abi_cxx11_(&bundleName,&match,2);
      local_158._0_8_ = bundleDir._M_string_length;
      local_158._8_8_ = bundleDir._M_dataplus._M_p;
      soName._M_dataplus._M_p = (pointer)bundleName._M_string_length;
      soName._M_string_length = (size_type)bundleName._M_dataplus._M_p;
      cmStrCat<char[5]>(&bundlePath,(cmAlphaNum *)local_158,(cmAlphaNum *)&soName,
                        (char (*) [5])".app");
      GetDestination((string *)local_158,this,config);
      std::__cxx11::string::string((string *)&soName,(string *)&bundlePath);
      __l_01._M_len = 1;
      __l_01._M_array = &soName;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_108,__l_01,&local_1c9);
      cmInstallGenerator::AddInstallRule
                (&this->super_cmInstallGenerator,os,(string *)local_158,cmInstallType_DIRECTORY,
                 &local_108,this->Optional,(char *)0x0,(this->FilePermissions)._M_dataplus._M_p,
                 (char *)0x0," USE_SOURCE_PERMISSIONS",indent,(char *)0x0);
      goto LAB_0038665d;
    }
    GetDestination((string *)&match,this,config);
    std::__cxx11::string::string((string *)local_158,(string *)&location);
    __l_03._M_len = 1;
    __l_03._M_array = (iterator)local_158;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&soName,__l_03,(allocator_type *)&bundleDir);
    cmInstallGenerator::AddInstallRule
              (&this->super_cmInstallGenerator,os,(string *)&match,cmInstallType_EXECUTABLE,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&soName,this->Optional,(this->FilePermissions)._M_dataplus._M_p,(char *)0x0,
               (char *)0x0,(char *)0x0,indent,(char *)0x0);
LAB_00386953:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&soName);
    std::__cxx11::string::~string((string *)local_158);
    this_00 = &match;
  }
  else {
    if (TVar2 == SHARED_LIBRARY) {
      bVar1 = cmGeneratorTarget::IsFrameworkOnApple(this->Target);
      if (!bVar1) {
        std::__cxx11::string::string((string *)&match,(string *)&location);
        __l_02._M_len = 1;
        __l_02._M_array = (iterator)&match;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&bundlePath,__l_02,(allocator_type *)local_158);
        std::__cxx11::string::~string((string *)&match);
        cmGeneratorTarget::GetSOName(&soName,this->Target,config);
        cmGeneratorTarget::GetDirectory(&bundleName,this->Target,config,RuntimeBinaryArtifact);
        match.startp[0] = (char *)bundleName._M_string_length;
        match.startp[1] = bundleName._M_dataplus._M_p;
        local_158._8_8_ = local_158 + 0x10;
        local_158._0_8_ = (pointer)0x1;
        local_158[0x10] = '/';
        cmStrCat<std::__cxx11::string>
                  (&bundleDir,(cmAlphaNum *)&match,(cmAlphaNum *)local_158,&soName);
        std::__cxx11::string::~string((string *)&bundleName);
        if (soName._M_string_length != 0) {
          bVar1 = std::operator!=(&bundleDir,&location);
          if (bVar1) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&bundlePath,&bundleDir);
          }
        }
        GetDestination((string *)&match,this,config);
        cmInstallGenerator::AddInstallRule
                  (&this->super_cmInstallGenerator,os,(string *)&match,cmInstallType_SHARED_LIBRARY,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&bundlePath,this->Optional,(this->FilePermissions)._M_dataplus._M_p,
                   (char *)0x0,(char *)0x0,(char *)0x0,indent,(char *)0x0);
        std::__cxx11::string::~string((string *)&match);
        std::__cxx11::string::~string((string *)&bundleDir);
        std::__cxx11::string::~string((string *)&soName);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&bundlePath);
        goto LAB_00386977;
      }
      memset(&match,0,0xa8);
      bVar1 = cmsys::RegularExpression::find
                        ((RegularExpression *)(anonymous_namespace)::FrameworkRegularExpression,
                         location._M_dataplus._M_p,&match);
      if (!bVar1) goto LAB_00386977;
      cmsys::RegularExpressionMatch::match_abi_cxx11_(&bundleDir,&match,1);
      cmsys::RegularExpressionMatch::match_abi_cxx11_(&bundleName,&match,2);
      local_158._0_8_ = bundleDir._M_string_length;
      local_158._8_8_ = bundleDir._M_dataplus._M_p;
      soName._M_dataplus._M_p = (pointer)bundleName._M_string_length;
      soName._M_string_length = (size_type)bundleName._M_dataplus._M_p;
      cmStrCat<char[11]>(&bundlePath,(cmAlphaNum *)local_158,(cmAlphaNum *)&soName,
                         (char (*) [11])".framework");
      GetDestination((string *)local_158,this,config);
      std::__cxx11::string::string((string *)&soName,(string *)&bundlePath);
      __l_00._M_len = 1;
      __l_00._M_array = &soName;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_108,__l_00,&local_1c9);
      cmInstallGenerator::AddInstallRule
                (&this->super_cmInstallGenerator,os,(string *)local_158,cmInstallType_DIRECTORY,
                 &local_108,this->Optional,(char *)0x0,(this->FilePermissions)._M_dataplus._M_p,
                 (char *)0x0," USE_SOURCE_PERMISSIONS",indent,(char *)0x0);
    }
    else {
      if (TVar2 != MODULE_LIBRARY) {
        __assert_fail("false && \"This should never happen\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallImportedRuntimeArtifactsGenerator.cxx"
                      ,0x8f,
                      "virtual void cmInstallImportedRuntimeArtifactsGenerator::GenerateScriptForConfig(std::ostream &, const std::string &, Indent)"
                     );
      }
      bVar1 = cmGeneratorTarget::IsCFBundleOnApple(this->Target);
      if (!bVar1) {
        GetDestination((string *)&match,this,config);
        std::__cxx11::string::string((string *)local_158,(string *)&location);
        __l_04._M_len = 1;
        __l_04._M_array = (iterator)local_158;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&soName,__l_04,(allocator_type *)&bundleDir);
        cmInstallGenerator::AddInstallRule
                  (&this->super_cmInstallGenerator,os,(string *)&match,cmInstallType_MODULE_LIBRARY,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&soName,this->Optional,(this->FilePermissions)._M_dataplus._M_p,(char *)0x0,
                   (char *)0x0,(char *)0x0,indent,(char *)0x0);
        goto LAB_00386953;
      }
      memset(&match,0,0xa8);
      bVar1 = cmsys::RegularExpression::find
                        ((RegularExpression *)(anonymous_namespace)::CFBundleRegularExpression,
                         location._M_dataplus._M_p,&match);
      if (!bVar1) goto LAB_00386977;
      cmsys::RegularExpressionMatch::match_abi_cxx11_(&bundleDir,&match,1);
      cmsys::RegularExpressionMatch::match_abi_cxx11_(&bundleName,&match,2);
      local_158._0_8_ = bundleDir._M_string_length;
      local_158._8_8_ = bundleDir._M_dataplus._M_p;
      soName._M_dataplus._M_p = (pointer)bundleName._M_string_length;
      soName._M_string_length = (size_type)bundleName._M_dataplus._M_p;
      cmStrCat<char[8]>(&bundlePath,(cmAlphaNum *)local_158,(cmAlphaNum *)&soName,
                        (char (*) [8])".bundle");
      GetDestination((string *)local_158,this,config);
      std::__cxx11::string::string((string *)&soName,(string *)&bundlePath);
      __l._M_len = 1;
      __l._M_array = &soName;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_108,__l,&local_1c9);
      cmInstallGenerator::AddInstallRule
                (&this->super_cmInstallGenerator,os,(string *)local_158,cmInstallType_DIRECTORY,
                 &local_108,this->Optional,(char *)0x0,(this->FilePermissions)._M_dataplus._M_p,
                 (char *)0x0," USE_SOURCE_PERMISSIONS",indent,(char *)0x0);
    }
LAB_0038665d:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_108);
    std::__cxx11::string::~string((string *)&soName);
    std::__cxx11::string::~string((string *)local_158);
    std::__cxx11::string::~string((string *)&bundlePath);
    std::__cxx11::string::~string((string *)&bundleName);
    this_00 = (RegularExpressionMatch *)&bundleDir;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_00386977:
  std::__cxx11::string::~string((string *)&location);
  return;
}

Assistant:

void cmInstallImportedRuntimeArtifactsGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  auto location = this->Target->GetFullPath(config);

  switch (this->Target->GetType()) {
    case cmStateEnums::EXECUTABLE:
      if (this->Target->IsBundleOnApple()) {
        cmsys::RegularExpressionMatch match;
        if (BundleRegularExpression.find(location.c_str(), match)) {
          auto bundleDir = match.match(1);
          auto bundleName = match.match(2);
          auto bundlePath = cmStrCat(bundleDir, bundleName, ".app");
          this->AddInstallRule(os, this->GetDestination(config),
                               cmInstallType_DIRECTORY, { bundlePath },
                               this->Optional, nullptr,
                               this->FilePermissions.c_str(), nullptr,
                               " USE_SOURCE_PERMISSIONS", indent);
        }
      } else {
        this->AddInstallRule(os, this->GetDestination(config),
                             cmInstallType_EXECUTABLE, { location },
                             this->Optional, this->FilePermissions.c_str(),
                             nullptr, nullptr, nullptr, indent);
      }
      break;
    case cmStateEnums::SHARED_LIBRARY:
      if (this->Target->IsFrameworkOnApple()) {
        cmsys::RegularExpressionMatch match;
        if (FrameworkRegularExpression.find(location.c_str(), match)) {
          auto frameworkDir = match.match(1);
          auto frameworkName = match.match(2);
          auto frameworkPath =
            cmStrCat(frameworkDir, frameworkName, ".framework");
          this->AddInstallRule(os, this->GetDestination(config),
                               cmInstallType_DIRECTORY, { frameworkPath },
                               this->Optional, nullptr,
                               this->FilePermissions.c_str(), nullptr,
                               " USE_SOURCE_PERMISSIONS", indent);
        }
      } else {
        std::vector<std::string> files{ location };
        auto soName = this->Target->GetSOName(config);
        auto soNameFile =
          cmStrCat(this->Target->GetDirectory(config), '/', soName);
        if (!soName.empty() && soNameFile != location) {
          files.push_back(soNameFile);
        }
        this->AddInstallRule(os, this->GetDestination(config),
                             cmInstallType_SHARED_LIBRARY, files,
                             this->Optional, this->FilePermissions.c_str(),
                             nullptr, nullptr, nullptr, indent);
      }
      break;
    case cmStateEnums::MODULE_LIBRARY:
      if (this->Target->IsCFBundleOnApple()) {
        cmsys::RegularExpressionMatch match;
        if (CFBundleRegularExpression.find(location.c_str(), match)) {
          auto bundleDir = match.match(1);
          auto bundleName = match.match(2);
          auto bundlePath = cmStrCat(bundleDir, bundleName, ".bundle");
          this->AddInstallRule(os, this->GetDestination(config),
                               cmInstallType_DIRECTORY, { bundlePath },
                               this->Optional, nullptr,
                               this->FilePermissions.c_str(), nullptr,
                               " USE_SOURCE_PERMISSIONS", indent);
        }
      } else {
        this->AddInstallRule(os, this->GetDestination(config),
                             cmInstallType_MODULE_LIBRARY, { location },
                             this->Optional, this->FilePermissions.c_str(),
                             nullptr, nullptr, nullptr, indent);
      }
      break;
    default:
      assert(false && "This should never happen");
      break;
  }
}